

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O1

int socket_set_nonblocking(int socket,int nonblocking)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = fcntl(socket,3,0);
  iVar2 = fcntl(socket,4,(ulong)((uint)(nonblocking != 0) << 0xb | uVar1 & 0xfffff7ff));
  return iVar2 >> 0x1f;
}

Assistant:

int socket_set_nonblocking(int socket, int nonblocking)
{
#ifdef _WIN32
    u_long modearg = nonblocking;
    if (ioctlsocket(socket, FIONBIO, &modearg) != NO_ERROR)
        return -1;
#else
    int sockflags = fcntl(socket, F_GETFL, 0);
    if (nonblocking)
        sockflags |= O_NONBLOCK;
    else
        sockflags &= ~O_NONBLOCK;
    if (fcntl(socket, F_SETFL, sockflags) < 0)
        return -1;
#endif
    return 0;
}